

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::BaseCompiler::addFuncNode
          (BaseCompiler *this,FuncNode **out,FuncSignature *signature)

{
  char *comment;
  Error EVar1;
  
  comment = (this->super_BaseBuilder).super_BaseEmitter._inlineComment;
  (this->super_BaseBuilder).super_BaseEmitter._instOptions = kNone;
  (this->super_BaseBuilder).super_BaseEmitter._extraReg._signature = 0;
  *(undefined8 *)&(this->super_BaseBuilder).super_BaseEmitter._extraReg._id = 0;
  *(undefined4 *)((long)&(this->super_BaseBuilder).super_BaseEmitter._inlineComment + 4) = 0;
  EVar1 = newFuncNode(this,out,signature);
  if (EVar1 == 0) {
    BaseBuilder_assignInlineComment(&this->super_BaseBuilder,(BaseNode *)*out,comment);
    addFunc(this,*out);
  }
  return EVar1;
}

Assistant:

Error BaseCompiler::addFuncNode(FuncNode** out, const FuncSignature& signature) {
  State state = _grabState();

  ASMJIT_PROPAGATE(newFuncNode(out, signature));
  ASMJIT_ASSUME(*out != nullptr);

  BaseBuilder_assignInlineComment(this, *out, state.comment);

  addFunc(*out);
  return kErrorOk;
}